

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int size;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  LogMessage local_88;
  string local_50;
  LogFinisher local_29;
  ulong value;
  
  sVar1 = output->_M_string_length;
  size = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,size);
  if ((value & 0xffffffff80000000) == 0) {
    std::__cxx11::string::resize((ulong)output);
    SerializeToArrayImpl(this,(uint8 *)((output->_M_dataplus)._M_p + sVar1),size);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
               ,0x1c9);
    (*this->_vptr_MessageLite[2])(&local_50,this);
    pLVar2 = internal::LogMessage::operator<<(&local_88,&local_50);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," exceeded maximum protobuf size of 2GB: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_29,pLVar2);
    std::__cxx11::string::~string((string *)&local_50);
    internal::LogMessage::~LogMessage(&local_88);
  }
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}